

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syncprod.cc
# Opt level: O2

state_status_t
tchecker::syncprod::next
          (system_t *system,vloc_sptr_t *vloc,vedge_sptr_t *vedge,sync_id_t *sync_id,
          outgoing_edges_value_t *sync_edges)

{
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  bool bVar4;
  make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *pmVar5;
  make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL> *pmVar6;
  make_array_t<unsigned_int,_4UL,_tchecker::vedge_base_t> *pmVar7;
  uint *puVar8;
  make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *pmVar9;
  invalid_argument *piVar10;
  process_id_t pid;
  capacity_t i;
  undefined1 local_90 [24];
  edges_iterator_t local_78;
  edges_iterator_t __end2;
  edges_iterator_t __begin2;
  
  local_90._16_8_ = sync_edges;
  local_78._it._M_current = (iterator)(iterator)sync_id;
  pmVar5 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::
           operator->(vloc);
  uVar1 = (pmVar5->super_vloc_t).super_loc_array_t.super_vloc_base_t.
          super_array_capacity_t<unsigned_int>._capacity;
  pmVar6 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>::
           operator->(vedge);
  if (uVar1 != (pmVar6->super_vedge_t).super_edge_array_t.super_vedge_base_t.
               super_array_capacity_t<unsigned_int>._capacity) {
    piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar10,"incompatible vloc and vedge");
    __cxa_throw(piVar10,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  for (i = 0; uVar3 = local_90._16_8_, uVar1 != i; i = i + 1) {
    pmVar7 = (make_array_t<unsigned_int,_4UL,_tchecker::vedge_base_t> *)
             intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>
             ::operator*(vedge);
    puVar8 = make_array_t<unsigned_int,_4UL,_tchecker::vedge_base_t>::operator[](pmVar7,i);
    *puVar8 = 0xffffffff;
  }
  edges_iterator_t::edges_iterator_t(&__begin2,(edges_iterator_t *)(local_90._16_8_ + 8));
  edges_iterator_t::edges_iterator_t
            (&__end2,&((range_t<tchecker::syncprod::edges_iterator_t,_tchecker::syncprod::edges_iterator_t>
                        *)(uVar3 + 8))->_end);
  while( true ) {
    bVar4 = edges_iterator_t::operator!=(&__begin2,&__end2);
    if (!bVar4) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&__end2._async_edge.
                  super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&__begin2._async_edge.
                  super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      *(sync_id_t *)local_78._it._M_current = *(sync_id_t *)local_90._16_8_;
      return 1;
    }
    edges_iterator_t::operator*((edges_iterator_t *)local_90);
    if (uVar1 <= *(process_id_t *)local_90._0_8_) break;
    pmVar9 = (make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *)
             intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
             ::operator*(vloc);
    puVar8 = make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t>::operator[]
                       (pmVar9,*(process_id_t *)local_90._0_8_);
    if (*puVar8 != *(loc_id_t *)(local_90._0_8_ + 8)) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_90 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&__end2._async_edge.
                  super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&__begin2._async_edge.
                  super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      return 2;
    }
    uVar2 = *(loc_id_t *)(local_90._0_8_ + 0xc);
    pmVar9 = (make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *)
             intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
             ::operator*(vloc);
    puVar8 = make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t>::operator[]
                       (pmVar9,*(process_id_t *)local_90._0_8_);
    *puVar8 = uVar2;
    uVar2 = *(edge_id_t *)(local_90._0_8_ + 4);
    pmVar7 = (make_array_t<unsigned_int,_4UL,_tchecker::vedge_base_t> *)
             intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>
             ::operator*(vedge);
    puVar8 = make_array_t<unsigned_int,_4UL,_tchecker::vedge_base_t>::operator[]
                       (pmVar7,*(process_id_t *)local_90._0_8_);
    *puVar8 = uVar2;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_90 + 8));
    edges_iterator_t::operator++(&__begin2);
  }
  piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar10,"incompatible edges");
  __cxa_throw(piVar10,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

tchecker::state_status_t next(tchecker::syncprod::system_t const & system, tchecker::vloc_sptr_t const & vloc,
                              tchecker::vedge_sptr_t const & vedge, tchecker::sync_id_t & sync_id,
                              tchecker::syncprod::outgoing_edges_value_t const & sync_edges)
{
  auto size = vloc->size();
  if (size != vedge->size())
    throw std::invalid_argument("incompatible vloc and vedge");

  for (tchecker::process_id_t pid = 0; pid < size; ++pid)
    (*vedge)[pid] = tchecker::NO_EDGE;

  for (tchecker::system::edge_const_shared_ptr_t const & edge : sync_edges.edges) {
    if (edge->pid() >= size)
      throw std::invalid_argument("incompatible edges");
    if ((*vloc)[edge->pid()] != edge->src())
      return tchecker::STATE_INCOMPATIBLE_EDGE;
    (*vloc)[edge->pid()] = edge->tgt();
    (*vedge)[edge->pid()] = edge->id();
  }

  sync_id = sync_edges.sync_id;

  return tchecker::STATE_OK;
}